

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O3

StatusOr<google::protobuf::FeatureResolver> * __thiscall
google::protobuf::(anonymous_namespace)::
SetupFeatureResolver<google::protobuf::internal::ExtensionIdentifier<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false>>
          (StatusOr<google::protobuf::FeatureResolver> *__return_storage_ptr__,
          _anonymous_namespace_ *this,Edition edition,
          ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
          extensions)

{
  StatusOr<google::protobuf::FeatureResolver> *extraout_RAX;
  Metadata MVar1;
  Metadata MVar2;
  Span<const_google::protobuf::FieldDescriptor_*const> extensions_00;
  Status _status;
  StatusOr<google::protobuf::FeatureSetDefaults> defaults;
  Edition in_stack_ffffffffffffff88;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1 local_70;
  anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1 local_68;
  FeatureSetDefaults local_60;
  
  MVar1 = FeatureSet::GetMetadata((FeatureSet *)&_FeatureSet_default_instance_);
  MVar2 = FeatureSet::GetMetadata((FeatureSet *)&_FeatureSet_default_instance_);
  local_70 = (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)
             GetExtension<google::protobuf::internal::ExtensionIdentifier<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false>>
                       ((ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
                         *)((ulong)this & 0xffffffff),MVar2.descriptor);
  extensions_00.len_ = 1000;
  extensions_00.ptr_ = (pointer)0x1;
  FeatureResolver::CompileDefaults
            ((StatusOr<google::protobuf::FeatureSetDefaults> *)&local_68.status_,
             (FeatureResolver *)MVar1.descriptor,(Descriptor *)&local_70.status_,extensions_00,
             EDITION_99997_TEST_ONLY,in_stack_ffffffffffffff88);
  local_70 = local_68;
  if (((ulong)local_68 & 1) == 0) {
    LOCK();
    *(int *)local_68 = *(int *)local_68 + 1;
    UNLOCK();
  }
  if (local_68 ==
      (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSetDefaults>_1)0x1) {
    FeatureResolver::Create(__return_storage_ptr__,EDITION_2023,&local_60);
  }
  else {
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureResolver>::
    StatusOrData<const_absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureResolver>,
               &local_70.status_);
    absl::lts_20250127::Status::~Status(&local_70.status_);
  }
  absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSetDefaults>::
  ~StatusOrData((StatusOrData<google::protobuf::FeatureSetDefaults> *)&local_68.status_);
  return extraout_RAX;
}

Assistant:

absl::StatusOr<FeatureResolver> SetupFeatureResolver(Edition edition,
                                                     Extensions... extensions) {
  absl::StatusOr<FeatureSetDefaults> defaults =
      FeatureResolver::CompileDefaults(FeatureSet::descriptor(),
                                       {GetExtension(extensions)...},
                                       EDITION_2023, EDITION_99997_TEST_ONLY);
  RETURN_IF_ERROR(defaults.status());
  return FeatureResolver::Create(edition, *defaults);
}